

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GeneralBlockPanelKernel.h
# Opt level: O0

void __thiscall
Eigen::internal::gemm_pack_rhs<double,_long,_4,_0,_false,_true>::operator()
          (gemm_pack_rhs<double,_long,_4,_0,_false,_true> *this,double *blockB,double *rhs,
          long rhsStride,long depth,long cols,long stride,long offset)

{
  double *pdVar1;
  long local_98;
  long k_1;
  double *b0_1;
  long j2_1;
  long k;
  double *b3;
  double *b2;
  double *b1;
  double *b0;
  long j2;
  long count;
  long packet_cols;
  long lStack_38;
  conj_if<false> cj;
  long cols_local;
  long depth_local;
  long rhsStride_local;
  double *rhs_local;
  double *blockB_local;
  gemm_pack_rhs<double,_long,_4,_0,_false,_true> *this_local;
  
  lStack_38 = cols;
  ignore_unused_variable<long>(&stride);
  ignore_unused_variable<long>(&offset);
  if (stride < depth || stride < offset) {
    __assert_fail("((!PanelMode) && stride==0 && offset==0) || (PanelMode && stride>=depth && offset<=stride)"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zonotopes[P]zono_cpp/Eigen/src/Core/products/GeneralBlockPanelKernel.h"
                  ,0x4c6,
                  "void Eigen::internal::gemm_pack_rhs<double, long, 4, 0, false, true>::operator()(Scalar *, const Scalar *, Index, Index, Index, Index, Index) [Scalar = double, Index = long, nr = 4, StorageOrder = 0, Conjugate = false, PanelMode = true]"
                 );
  }
  b0_1 = (double *)(lStack_38 / 4 << 2);
  j2 = 0;
  for (b0 = (double *)0x0; (long)b0 < (long)b0_1; b0 = (double *)((long)b0 + 4)) {
    j2 = offset * 4 + j2;
    for (j2_1 = 0; j2_1 < depth; j2_1 = j2_1 + 1) {
      pdVar1 = conj_if<false>::operator()
                         ((conj_if<false> *)((long)&packet_cols + 7),
                          rhs + (long)b0 * rhsStride + j2_1);
      blockB[j2] = *pdVar1;
      pdVar1 = conj_if<false>::operator()
                         ((conj_if<false> *)((long)&packet_cols + 7),
                          rhs + ((long)b0 + 1) * rhsStride + j2_1);
      blockB[j2 + 1] = *pdVar1;
      pdVar1 = conj_if<false>::operator()
                         ((conj_if<false> *)((long)&packet_cols + 7),
                          rhs + ((long)b0 + 2) * rhsStride + j2_1);
      blockB[j2 + 2] = *pdVar1;
      pdVar1 = conj_if<false>::operator()
                         ((conj_if<false> *)((long)&packet_cols + 7),
                          rhs + ((long)b0 + 3) * rhsStride + j2_1);
      blockB[j2 + 3] = *pdVar1;
      j2 = j2 + 4;
    }
    j2 = ((stride - offset) - depth) * 4 + j2;
  }
  for (; (long)b0_1 < lStack_38; b0_1 = (double *)((long)b0_1 + 1)) {
    j2 = offset + j2;
    for (local_98 = 0; local_98 < depth; local_98 = local_98 + 1) {
      pdVar1 = conj_if<false>::operator()
                         ((conj_if<false> *)((long)&packet_cols + 7),
                          rhs + (long)b0_1 * rhsStride + local_98);
      blockB[j2] = *pdVar1;
      j2 = j2 + 1;
    }
    j2 = ((stride - offset) - depth) + j2;
  }
  return;
}

Assistant:

EIGEN_DONT_INLINE void gemm_pack_rhs<Scalar, Index, nr, ColMajor, Conjugate, PanelMode>
  ::operator()(Scalar* blockB, const Scalar* rhs, Index rhsStride, Index depth, Index cols, Index stride, Index offset)
{
  EIGEN_ASM_COMMENT("EIGEN PRODUCT PACK RHS COLMAJOR");
  EIGEN_UNUSED_VARIABLE(stride)
  EIGEN_UNUSED_VARIABLE(offset)
  eigen_assert(((!PanelMode) && stride==0 && offset==0) || (PanelMode && stride>=depth && offset<=stride));
  conj_if<NumTraits<Scalar>::IsComplex && Conjugate> cj;
  Index packet_cols = (cols/nr) * nr;
  Index count = 0;
  for(Index j2=0; j2<packet_cols; j2+=nr)
  {
    // skip what we have before
    if(PanelMode) count += nr * offset;
    const Scalar* b0 = &rhs[(j2+0)*rhsStride];
    const Scalar* b1 = &rhs[(j2+1)*rhsStride];
    const Scalar* b2 = &rhs[(j2+2)*rhsStride];
    const Scalar* b3 = &rhs[(j2+3)*rhsStride];
    for(Index k=0; k<depth; k++)
    {
                blockB[count+0] = cj(b0[k]);
                blockB[count+1] = cj(b1[k]);
      if(nr==4) blockB[count+2] = cj(b2[k]);
      if(nr==4) blockB[count+3] = cj(b3[k]);
      count += nr;
    }
    // skip what we have after
    if(PanelMode) count += nr * (stride-offset-depth);
  }

  // copy the remaining columns one at a time (nr==1)
  for(Index j2=packet_cols; j2<cols; ++j2)
  {
    if(PanelMode) count += offset;
    const Scalar* b0 = &rhs[(j2+0)*rhsStride];
    for(Index k=0; k<depth; k++)
    {
      blockB[count] = cj(b0[k]);
      count += 1;
    }
    if(PanelMode) count += (stride-offset-depth);
  }
}